

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapping0.c
# Opt level: O0

vorbis_info_mapping * mapping0_unpack(vorbis_info *vi,oggpack_buffer *opb)

{
  void *pvVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  int temp;
  int testA;
  int testM;
  codec_setup_info *ci;
  vorbis_info_mapping0 *info;
  int i;
  oggpack_buffer *opb_local;
  vorbis_info *vi_local;
  
  vi_local = (vorbis_info *)calloc(1,0xc90);
  pvVar1 = vi->codec_setup;
  memset(vi_local,0,0xc90);
  lVar4 = oggpack_read(opb,1);
  if (lVar4 == 0) {
    vi_local->version = 1;
  }
  else {
    lVar4 = oggpack_read(opb,4);
    vi_local->version = (int)lVar4 + 1;
  }
  lVar4 = oggpack_read(opb,1);
  if (lVar4 != 0) {
    lVar4 = oggpack_read(opb,8);
    *(int *)((long)&vi_local[0x14].bitrate_window + 4) = (int)lVar4 + 1;
    for (info._4_4_ = 0; info._4_4_ < *(int *)((long)&vi_local[0x14].bitrate_window + 4);
        info._4_4_ = info._4_4_ + 1) {
      iVar2 = ilog(vi->channels);
      lVar4 = oggpack_read(opb,iVar2);
      iVar2 = (int)lVar4;
      *(int *)((long)&vi_local[0x14].codec_setup + (long)info._4_4_ * 4) = iVar2;
      iVar3 = ilog(vi->channels);
      lVar4 = oggpack_read(opb,iVar3);
      iVar3 = (int)lVar4;
      *(int *)((long)&vi_local[0x27].rate + (long)info._4_4_ * 4) = iVar3;
      if ((((iVar2 < 0) || (iVar3 < 0)) || (iVar2 == iVar3)) ||
         ((vi->channels <= iVar2 || (vi->channels <= iVar3)))) goto LAB_00156c7b;
    }
  }
  lVar4 = oggpack_read(opb,2);
  if (lVar4 < 1) {
    if (1 < vi_local->version) {
      for (info._4_4_ = 0; info._4_4_ < vi->channels; info._4_4_ = info._4_4_ + 1) {
        lVar4 = oggpack_read(opb,4);
        (&vi_local->channels)[info._4_4_] = (int)lVar4;
        if (vi_local->version <= (&vi_local->channels)[info._4_4_]) goto LAB_00156c7b;
      }
    }
    for (info._4_4_ = 0; info._4_4_ < vi_local->version; info._4_4_ = info._4_4_ + 1) {
      lVar4 = oggpack_read(opb,8);
      if (*(int *)((long)pvVar1 + 0x18) <= (int)lVar4) goto LAB_00156c7b;
      lVar4 = oggpack_read(opb,8);
      *(int *)((long)&vi_local[0x12].bitrate_upper + (long)info._4_4_ * 4 + 4) = (int)lVar4;
      if (*(int *)((long)pvVar1 + 0x1c) <=
          *(int *)((long)&vi_local[0x12].bitrate_upper + (long)info._4_4_ * 4 + 4))
      goto LAB_00156c7b;
      lVar4 = oggpack_read(opb,8);
      *(int *)((long)&vi_local[0x13].bitrate_nominal + (long)info._4_4_ * 4 + 4) = (int)lVar4;
      if (*(int *)((long)pvVar1 + 0x20) <=
          *(int *)((long)&vi_local[0x13].bitrate_nominal + (long)info._4_4_ * 4 + 4))
      goto LAB_00156c7b;
    }
  }
  else {
LAB_00156c7b:
    mapping0_free_info(vi_local);
    vi_local = (vorbis_info *)0x0;
  }
  return vi_local;
}

Assistant:

static vorbis_info_mapping *mapping0_unpack(vorbis_info *vi,oggpack_buffer *opb){
  int i;
  vorbis_info_mapping0 *info=(vorbis_info_mapping0 *)_ogg_calloc(1,sizeof(*info));
  codec_setup_info     *ci=(codec_setup_info *)vi->codec_setup;
  memset(info,0,sizeof(*info));

  if(oggpack_read(opb,1))
    info->submaps=oggpack_read(opb,4)+1;
  else
    info->submaps=1;

  if(oggpack_read(opb,1)){
    info->coupling_steps=oggpack_read(opb,8)+1;

    for(i=0;i<info->coupling_steps;i++){
      int testM=info->coupling_mag[i]=oggpack_read(opb,ilog(vi->channels));
      int testA=info->coupling_ang[i]=oggpack_read(opb,ilog(vi->channels));

      if(testM<0 || 
	 testA<0 || 
	 testM==testA || 
	 testM>=vi->channels ||
	 testA>=vi->channels) goto err_out;
    }

  }

  if(oggpack_read(opb,2)>0)goto err_out; /* 2,3:reserved */
    
  if(info->submaps>1){
    for(i=0;i<vi->channels;i++){
      info->chmuxlist[i]=oggpack_read(opb,4);
      if(info->chmuxlist[i]>=info->submaps)goto err_out;
    }
  }
  for(i=0;i<info->submaps;i++){
    int temp=oggpack_read(opb,8);
    if(temp>=ci->times)goto err_out;
    info->floorsubmap[i]=oggpack_read(opb,8);
    if(info->floorsubmap[i]>=ci->floors)goto err_out;
    info->residuesubmap[i]=oggpack_read(opb,8);
    if(info->residuesubmap[i]>=ci->residues)goto err_out;
  }

  return info;

 err_out:
  mapping0_free_info(info);
  return(NULL);
}